

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateCompiledContent
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRegexpPtr regexp,xmlNodePtr content)

{
  int iVar1;
  xmlElementType xVar2;
  int iVar3;
  xmlRegExecCtxtPtr exec_00;
  int local_3c;
  int oldperr;
  int ret;
  xmlNodePtr cur;
  xmlRegExecCtxtPtr exec;
  xmlNodePtr content_local;
  xmlRegexpPtr regexp_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  local_3c = 0;
  if ((ctxt == (xmlRelaxNGValidCtxtPtr)0x0) || (regexp == (xmlRegexpPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    iVar1 = ctxt->perr;
    exec_00 = xmlRegNewExecCtxt(regexp,xmlRelaxNGValidateCompiledCallback,ctxt);
    ctxt->perr = 0;
    for (_oldperr = content; _oldperr != (xmlNode *)0x0; _oldperr = _oldperr->next) {
      ctxt->state->seq = _oldperr;
      xVar2 = _oldperr->type;
      if (xVar2 == XML_ELEMENT_NODE) {
        if (_oldperr->ns == (xmlNs *)0x0) {
          local_3c = xmlRegExecPushString(exec_00,_oldperr->name,ctxt);
        }
        else {
          local_3c = xmlRegExecPushString2(exec_00,_oldperr->name,_oldperr->ns->href,ctxt);
        }
        if (local_3c < 0) {
          xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_ELEMWRONG,_oldperr->name,(xmlChar *)0x0,0);
        }
      }
      else if (((xVar2 == XML_TEXT_NODE || xVar2 == XML_CDATA_SECTION_NODE) &&
               (iVar3 = xmlIsBlankNode(_oldperr), iVar3 == 0)) &&
              (local_3c = xmlRegExecPushString(exec_00,(xmlChar *)"#text",ctxt), local_3c < 0)) {
        xmlRelaxNGAddValidError
                  (ctxt,XML_RELAXNG_ERR_TEXTWRONG,_oldperr->parent->name,(xmlChar *)0x0,0);
      }
      if (local_3c < 0) break;
    }
    iVar3 = xmlRegExecPushString(exec_00,(xmlChar *)0x0,(void *)0x0);
    if (iVar3 == 1) {
      local_3c = 0;
      ctxt->state->seq = (xmlNodePtr)0x0;
    }
    else {
      if ((iVar3 == 0) &&
         (xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOELEM,"",(xmlChar *)0x0,0),
         (ctxt->flags & 1U) == 0)) {
        xmlRelaxNGDumpValidError(ctxt);
      }
      local_3c = -1;
    }
    xmlRegFreeExecCtxt(exec_00);
    if ((local_3c == 0) && (ctxt->perr != 0)) {
      local_3c = ctxt->perr;
    }
    ctxt->perr = iVar1;
    ctxt_local._4_4_ = local_3c;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGValidateCompiledContent(xmlRelaxNGValidCtxtPtr ctxt,
                                  xmlRegexpPtr regexp, xmlNodePtr content)
{
    xmlRegExecCtxtPtr exec;
    xmlNodePtr cur;
    int ret = 0;
    int oldperr;

    if ((ctxt == NULL) || (regexp == NULL))
        return (-1);
    oldperr = ctxt->perr;
    exec = xmlRegNewExecCtxt(regexp,
                             xmlRelaxNGValidateCompiledCallback, ctxt);
    ctxt->perr = 0;
    cur = content;
    while (cur != NULL) {
        ctxt->state->seq = cur;
        switch (cur->type) {
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
                if (xmlIsBlankNode(cur))
                    break;
                ret = xmlRegExecPushString(exec, BAD_CAST "#text", ctxt);
                if (ret < 0) {
                    VALID_ERR2(XML_RELAXNG_ERR_TEXTWRONG,
                               cur->parent->name);
                }
                break;
            case XML_ELEMENT_NODE:
                if (cur->ns != NULL) {
                    ret = xmlRegExecPushString2(exec, cur->name,
                                                cur->ns->href, ctxt);
                } else {
                    ret = xmlRegExecPushString(exec, cur->name, ctxt);
                }
                if (ret < 0) {
                    VALID_ERR2(XML_RELAXNG_ERR_ELEMWRONG, cur->name);
                }
                break;
            default:
                break;
        }
        if (ret < 0)
            break;
        /*
         * Switch to next element
         */
        cur = cur->next;
    }
    ret = xmlRegExecPushString(exec, NULL, NULL);
    if (ret == 1) {
        ret = 0;
        ctxt->state->seq = NULL;
    } else if (ret == 0) {
        /*
         * TODO: get some of the names needed to exit the current state of exec
         */
        VALID_ERR2(XML_RELAXNG_ERR_NOELEM, BAD_CAST "");
        ret = -1;
        if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
            xmlRelaxNGDumpValidError(ctxt);
    } else {
        ret = -1;
    }
    xmlRegFreeExecCtxt(exec);
    /*
     * There might be content model errors outside of the pure
     * regexp validation, e.g. for attribute values.
     */
    if ((ret == 0) && (ctxt->perr != 0)) {
        ret = ctxt->perr;
    }
    ctxt->perr = oldperr;
    return (ret);
}